

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

int send_list(socket_server *ss,socket *s,wb_list *list,socket_message *result)

{
  ushort uVar1;
  write_buffer *pwVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  int unaff_EBP;
  write_buffer *tmp;
  int iVar7;
  socklen_t __addr_len;
  sockaddr local_58;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  int *local_38;
  
  if (s->protocol == 0) {
    pwVar2 = list->head;
    while (pwVar2 != (write_buffer *)0x0) {
      do {
        sVar4 = write(s->fd,pwVar2->ptr,(long)pwVar2->sz);
        uVar3 = (uint)sVar4;
        if ((int)uVar3 < 0) {
          piVar5 = __errno_location();
          if (*piVar5 == 4) {
            iVar6 = 5;
          }
          else {
            if (*piVar5 == 0xb) goto LAB_00111f07;
            force_close(ss,s,result);
            unaff_EBP = 1;
            iVar6 = 1;
          }
        }
        else {
          s->wb_size = s->wb_size - (ulong)(uVar3 & 0x7fffffff);
          iVar6 = 4;
          iVar7 = pwVar2->sz - uVar3;
          if (iVar7 != 0) {
            pwVar2->ptr = pwVar2->ptr + (uVar3 & 0x7fffffff);
            pwVar2->sz = iVar7;
LAB_00111f07:
            iVar6 = 1;
            unaff_EBP = -1;
          }
        }
      } while (iVar6 == 5);
      if (iVar6 != 4) {
        return unaff_EBP;
      }
      list->head = pwVar2->next;
      if (pwVar2->userobject == true) {
        (*(ss->soi).free)(pwVar2->buffer);
      }
      else {
        free(pwVar2->buffer);
      }
      free(pwVar2);
      pwVar2 = list->head;
    }
LAB_00111f71:
    list->tail = (write_buffer *)0x0;
  }
  else {
    local_38 = &s->id;
    do {
      pwVar2 = list->head;
      if (pwVar2 == (write_buffer *)0x0) goto LAB_00111f71;
      uVar1 = s->protocol;
      __addr_len = 0;
      if (uVar1 == pwVar2->udp_address[0]) {
        if (uVar1 == 2) {
          uStack_40 = 0;
          local_58.sa_data._0_2_ = *(undefined2 *)(pwVar2->udp_address + 1);
          local_58.sa_family = 10;
          local_58.sa_data._2_4_ = 0;
          local_58.sa_data._6_4_ = SUB84(*(undefined8 *)(pwVar2->udp_address + 3),0);
          local_58.sa_data._10_4_ = SUB84((ulong)*(undefined8 *)(pwVar2->udp_address + 3) >> 0x20,0)
          ;
          uStack_48 = (undefined4)*(undefined8 *)(pwVar2->udp_address + 0xb);
          uStack_44 = (undefined4)((ulong)*(undefined8 *)(pwVar2->udp_address + 0xb) >> 0x20);
          __addr_len = 0x1c;
        }
        else if (uVar1 == 1) {
          local_58.sa_data[6] = '\0';
          local_58.sa_data[7] = '\0';
          local_58.sa_data[8] = '\0';
          local_58.sa_data[9] = '\0';
          local_58.sa_data[10] = '\0';
          local_58.sa_data[0xb] = '\0';
          local_58.sa_data[0xc] = '\0';
          local_58.sa_data[0xd] = '\0';
          local_58.sa_data._0_2_ = *(undefined2 *)(pwVar2->udp_address + 1);
          local_58.sa_family = 2;
          local_58.sa_data._2_4_ = *(undefined4 *)(pwVar2->udp_address + 3);
          __addr_len = 0x10;
        }
      }
      sVar4 = sendto(s->fd,pwVar2->ptr,(long)pwVar2->sz,0,&local_58,__addr_len);
      if ((int)sVar4 < 0) {
        piVar5 = __errno_location();
        if ((*piVar5 != 4) && (*piVar5 != 0xb)) {
          send_list_cold_1();
        }
      }
      else {
        s->wb_size = s->wb_size - (long)pwVar2->sz;
        list->head = pwVar2->next;
        if (pwVar2->userobject == true) {
          (*(ss->soi).free)(pwVar2->buffer);
        }
        else {
          free(pwVar2->buffer);
        }
        free(pwVar2);
      }
    } while (-1 < (int)sVar4);
  }
  return -1;
}

Assistant:

static int
send_list(struct socket_server *ss, struct socket *s, struct wb_list *list, struct socket_message *result) {
	if (s->protocol == PROTOCOL_TCP) {
		return send_list_tcp(ss, s, list, result);
	} else {
		return send_list_udp(ss, s, list, result);
	}
}